

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O0

int __kmp_api_omp_test_nest_lock(void **user_lock)

{
  int iVar1;
  kmp_int32 in_stack_0000000c;
  ident_t *in_stack_00000010;
  
  __kmp_get_global_thread_id_reg();
  iVar1 = __kmpc_test_nest_lock(in_stack_00000010,in_stack_0000000c,user_lock);
  return iVar1;
}

Assistant:

int FTN_STDCALL
xexpand(FTN_TEST_NEST_LOCK)( void **user_lock )
{
    #ifdef KMP_STUB
        if ( *((kmp_stub_lock_t *)user_lock) == UNINIT ) {
            // TODO: Issue an error.
        }; // if
        return ++(*((int *)user_lock));
    #else
        return __kmpc_test_nest_lock( NULL, __kmp_entry_gtid(), user_lock );
    #endif
}